

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O1

v256 * v256_unpacklo_s8_s16(v256 a)

{
  v256 *in_RDI;
  undefined1 auVar1 [16];
  v128 alVar9;
  undefined1 in_XMM1_Bp;
  undefined1 auVar10 [16];
  v128 alVar11;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar10._0_3_ = (uint3)(byte)a.val[0][1] << 8;
  auVar10[3] = a.val[0][1]._1_1_;
  auVar10[4] = 0;
  auVar10[5] = a.val[0][1]._2_1_;
  auVar10[6] = 0;
  auVar10[7] = a.val[0][1]._3_1_;
  auVar10[8] = 0;
  auVar10[9] = a.val[0][1]._4_1_;
  auVar10[10] = 0;
  auVar10[0xb] = a.val[0][1]._5_1_;
  auVar10[0xc] = 0;
  auVar10[0xd] = a.val[0][1]._6_1_;
  auVar10[0xe] = in_XMM1_Bp;
  auVar10[0xf] = a.val[0][1]._7_1_;
  alVar11 = (v128)psraw(auVar10,8);
  auVar8._0_14_ = a.val[0]._0_14_;
  auVar8[0xe] = a.val[0][0]._7_1_;
  auVar8[0xf] = a.val[0][0]._7_1_;
  auVar7._14_2_ = auVar8._14_2_;
  auVar7._0_13_ = a.val[0]._0_13_;
  auVar7[0xd] = a.val[0][0]._6_1_;
  auVar6._13_3_ = auVar7._13_3_;
  auVar6._0_12_ = a.val[0]._0_12_;
  auVar6[0xc] = a.val[0][0]._6_1_;
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_11_ = a.val[0]._0_11_;
  auVar5[0xb] = a.val[0][0]._5_1_;
  auVar4._11_5_ = auVar5._11_5_;
  auVar4._0_10_ = a.val[0]._0_10_;
  auVar4[10] = a.val[0][0]._5_1_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_9_ = a.val[0]._0_9_;
  auVar3[9] = a.val[0][0]._4_1_;
  auVar2._9_7_ = auVar3._9_7_;
  auVar2._0_8_ = a.val[0][0];
  auVar2[8] = a.val[0][0]._4_1_;
  auVar1._8_8_ = auVar2._8_8_;
  auVar1[7] = a.val[0][0]._3_1_;
  auVar1[6] = a.val[0][0]._3_1_;
  auVar1[5] = a.val[0][0]._2_1_;
  auVar1[4] = a.val[0][0]._2_1_;
  auVar1[3] = a.val[0][0]._1_1_;
  auVar1[2] = a.val[0][0]._1_1_;
  auVar1[0] = (undefined1)a.val[0][0];
  auVar1[1] = auVar1[0];
  alVar9 = (v128)psraw(auVar1,8);
  in_RDI->val[1] = alVar11;
  in_RDI->val[0] = alVar9;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_unpacklo_s8_s16(v256 a) {
  return v256_from_v128(v128_unpackhi_s8_s16(a.val[0]),
                        v128_unpacklo_s8_s16(a.val[0]));
}